

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-timesamples-array.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseTimeSampleValueOfArrayType
          (AsciiParser *this,uint32_t type_id,Value *result)

{
  bool bVar1;
  ostream *poVar2;
  uint32_t tyid;
  uint32_t tyid_00;
  uint32_t tyid_01;
  uint32_t tyid_02;
  uint32_t tyid_03;
  uint32_t tyid_04;
  uint32_t tyid_05;
  uint32_t tyid_06;
  uint32_t tyid_07;
  uint32_t tyid_08;
  uint32_t tyid_09;
  uint32_t tyid_10;
  uint32_t tyid_11;
  uint32_t tyid_12;
  uint32_t tyid_13;
  uint32_t tyid_14;
  uint32_t tyid_15;
  uint32_t tyid_16;
  uint32_t tyid_17;
  uint32_t tyid_18;
  uint32_t tyid_19;
  uint32_t tyid_20;
  uint32_t tyid_21;
  uint32_t tyid_22;
  uint32_t tyid_23;
  uint32_t tyid_24;
  uint32_t tyid_25;
  uint32_t tyid_26;
  uint32_t tyid_27;
  uint32_t tyid_28;
  uint32_t tyid_29;
  uint32_t tyid_30;
  uint32_t tyid_31;
  uint32_t tyid_32;
  uint32_t tyid_33;
  uint32_t tyid_34;
  uint32_t tyid_35;
  uint32_t tyid_36;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> typed_val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  storage_union local_200;
  undefined **local_1f0;
  string local_1e8;
  string local_1c8;
  ostringstream ss_e;
  vtable_type *local_198;
  
  if (result == (Value *)0x0) {
    return false;
  }
  bVar1 = MaybeNone(this);
  if (bVar1) {
    linb::any::operator=(&result->v_,(ValueBlock *)&ss_e);
    return true;
  }
  local_1f0 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
  local_200.dynamic = (void *)0x0;
  switch(type_id) {
  case 6:
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<tinyusdz::Token>(this,&typed_val);
    if (bVar1) {
      linb::any::construct<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>const&>
                ((any *)&ss_e,&typed_val);
      linb::any::operator=((any *)&local_200,(any *)&ss_e);
      if (local_198 != (vtable_type *)0x0) {
        (*local_198->destroy)((storage_union *)&ss_e);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValueOfArrayType");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xa6);
      ::std::operator<<(poVar2," ");
      tinyusdz::value::GetTypeName_abi_cxx11_(&local_1c8,(value *)0x6,tyid_11);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"Failed to parse value with requested type `",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1c8);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_220,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"[]`");
      poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&local_220);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&local_220);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    }
    ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector(&typed_val);
    break;
  case 7:
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<std::__cxx11::string>
                      (this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&typed_val);
    if (bVar1) {
      linb::any::
      construct<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>
                ((any *)&ss_e,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&typed_val);
      linb::any::operator=((any *)&local_200,(any *)&ss_e);
      if (local_198 != (vtable_type *)0x0) {
        (*local_198->destroy)((storage_union *)&ss_e);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValueOfArrayType");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xa7);
      ::std::operator<<(poVar2," ");
      tinyusdz::value::GetTypeName_abi_cxx11_(&local_1c8,(value *)0x7,tyid_17);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"Failed to parse value with requested type `",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1c8);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_220,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"[]`");
      poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&local_220);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&local_220);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&typed_val);
    break;
  default:
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValueOfArrayType");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xcb);
    ::std::operator<<(poVar2," ");
    tinyusdz::value::GetTypeName_abi_cxx11_(&local_1e8,(value *)(ulong)type_id,tyid);
    ::std::operator+(&local_220," : TODO: timeSamples type ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1e8
                    );
    poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&local_220);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::stringbuf::str();
    PushError(this,(string *)&local_220);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    goto LAB_002d7646;
  case 0xe:
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<tinyusdz::value::half>
                      (this,(vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *
                            )&typed_val);
    if (bVar1) {
      linb::any::
      construct<std::vector<tinyusdz::value::half,std::allocator<tinyusdz::value::half>>const&>
                ((any *)&ss_e,
                 (vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)&typed_val
                );
      linb::any::operator=((any *)&local_200,(any *)&ss_e);
      if (local_198 != (vtable_type *)0x0) {
        (*local_198->destroy)((storage_union *)&ss_e);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValueOfArrayType");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xad);
      ::std::operator<<(poVar2," ");
      tinyusdz::value::GetTypeName_abi_cxx11_(&local_1c8,(value *)0xe,tyid_18);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"Failed to parse value with requested type `",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1c8);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_220,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"[]`");
      poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&local_220);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&local_220);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    }
    ::std::_Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                  &typed_val);
    break;
  case 0xf:
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<int>(this,(vector<int,_std::allocator<int>_> *)&typed_val);
    if (bVar1) {
      linb::any::construct<std::vector<int,std::allocator<int>>const&>
                ((any *)&ss_e,(vector<int,_std::allocator<int>_> *)&typed_val);
      linb::any::operator=((any *)&local_200,(any *)&ss_e);
      if (local_198 != (vtable_type *)0x0) {
        (*local_198->destroy)((storage_union *)&ss_e);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValueOfArrayType");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xa9);
      ::std::operator<<(poVar2," ");
      tinyusdz::value::GetTypeName_abi_cxx11_(&local_1c8,(value *)0xf,tyid_22);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"Failed to parse value with requested type `",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1c8);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_220,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"[]`");
      poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&local_220);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&local_220);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    }
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&typed_val);
    break;
  case 0x10:
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<long>(this,(vector<long,_std::allocator<long>_> *)&typed_val);
    if (bVar1) {
      linb::any::construct<std::vector<long,std::allocator<long>>const&>
                ((any *)&ss_e,(vector<long,_std::allocator<long>_> *)&typed_val);
      linb::any::operator=((any *)&local_200,(any *)&ss_e);
      if (local_198 != (vtable_type *)0x0) {
        (*local_198->destroy)((storage_union *)&ss_e);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValueOfArrayType");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xab);
      ::std::operator<<(poVar2," ");
      tinyusdz::value::GetTypeName_abi_cxx11_(&local_1c8,(value *)0x10,tyid_19);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"Failed to parse value with requested type `",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1c8);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_220,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"[]`");
      poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&local_220);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&local_220);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    }
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
              ((_Vector_base<long,_std::allocator<long>_> *)&typed_val);
    break;
  case 0x11:
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<std::array<tinyusdz::value::half,2ul>>
                      (this,(vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                             *)&typed_val);
    if (bVar1) {
      linb::any::
      construct<std::vector<std::array<tinyusdz::value::half,2ul>,std::allocator<std::array<tinyusdz::value::half,2ul>>>const&>
                ((any *)&ss_e,
                 (vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                  *)&typed_val);
      linb::any::operator=((any *)&local_200,(any *)&ss_e);
      if (local_198 != (vtable_type *)0x0) {
        (*local_198->destroy)((storage_union *)&ss_e);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValueOfArrayType");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xae);
      ::std::operator<<(poVar2," ");
      tinyusdz::value::GetTypeName_abi_cxx11_(&local_1c8,(value *)0x11,tyid_21);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"Failed to parse value with requested type `",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1c8);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_220,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"[]`");
      poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&local_220);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&local_220);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    }
    ::std::
    _Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
    ::~_Vector_base((_Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                     *)&typed_val);
    break;
  case 0x12:
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<std::array<tinyusdz::value::half,3ul>>
                      (this,(vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                             *)&typed_val);
    if (bVar1) {
      linb::any::
      construct<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>const&>
                ((any *)&ss_e,
                 (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                  *)&typed_val);
      linb::any::operator=((any *)&local_200,(any *)&ss_e);
      if (local_198 != (vtable_type *)0x0) {
        (*local_198->destroy)((storage_union *)&ss_e);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValueOfArrayType");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xaf);
      ::std::operator<<(poVar2," ");
      tinyusdz::value::GetTypeName_abi_cxx11_(&local_1c8,(value *)0x12,tyid_26);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"Failed to parse value with requested type `",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1c8);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_220,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"[]`");
      poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&local_220);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&local_220);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    }
    ::std::
    _Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
    ::~_Vector_base((_Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                     *)&typed_val);
    break;
  case 0x13:
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<std::array<tinyusdz::value::half,4ul>>
                      (this,(vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                             *)&typed_val);
    if (bVar1) {
      linb::any::
      construct<std::vector<std::array<tinyusdz::value::half,4ul>,std::allocator<std::array<tinyusdz::value::half,4ul>>>const&>
                ((any *)&ss_e,
                 (vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                  *)&typed_val);
      linb::any::operator=((any *)&local_200,(any *)&ss_e);
      if (local_198 != (vtable_type *)0x0) {
        (*local_198->destroy)((storage_union *)&ss_e);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValueOfArrayType");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xb0);
      ::std::operator<<(poVar2," ");
      tinyusdz::value::GetTypeName_abi_cxx11_(&local_1c8,(value *)0x13,tyid_27);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"Failed to parse value with requested type `",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1c8);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_220,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"[]`");
      poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&local_220);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&local_220);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    }
    ::std::
    _Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
    ::~_Vector_base((_Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                     *)&typed_val);
    break;
  case 0x1b:
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<unsigned_int>
                      (this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&typed_val);
    if (bVar1) {
      linb::any::construct<std::vector<unsigned_int,std::allocator<unsigned_int>>const&>
                ((any *)&ss_e,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&typed_val);
      linb::any::operator=((any *)&local_200,(any *)&ss_e);
      if (local_198 != (vtable_type *)0x0) {
        (*local_198->destroy)((storage_union *)&ss_e);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValueOfArrayType");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xaa);
      ::std::operator<<(poVar2," ");
      tinyusdz::value::GetTypeName_abi_cxx11_(&local_1c8,(value *)0x1b,tyid_07);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"Failed to parse value with requested type `",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1c8);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_220,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"[]`");
      poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&local_220);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&local_220);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    }
    ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&typed_val);
    break;
  case 0x1c:
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<unsigned_long>
                      (this,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&typed_val);
    if (bVar1) {
      linb::any::construct<std::vector<unsigned_long,std::allocator<unsigned_long>>const&>
                ((any *)&ss_e,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&typed_val);
      linb::any::operator=((any *)&local_200,(any *)&ss_e);
      if (local_198 != (vtable_type *)0x0) {
        (*local_198->destroy)((storage_union *)&ss_e);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValueOfArrayType");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac);
      ::std::operator<<(poVar2," ");
      tinyusdz::value::GetTypeName_abi_cxx11_(&local_1c8,(value *)0x1c,tyid_29);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"Failed to parse value with requested type `",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1c8);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_220,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"[]`");
      poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&local_220);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&local_220);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    }
    ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&typed_val);
    break;
  case 0x28:
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<float>(this,(vector<float,_std::allocator<float>_> *)&typed_val);
    if (bVar1) {
      linb::any::construct<std::vector<float,std::allocator<float>>const&>
                ((any *)&ss_e,(vector<float,_std::allocator<float>_> *)&typed_val);
      linb::any::operator=((any *)&local_200,(any *)&ss_e);
      if (local_198 != (vtable_type *)0x0) {
        (*local_198->destroy)((storage_union *)&ss_e);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValueOfArrayType");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xa8);
      ::std::operator<<(poVar2," ");
      tinyusdz::value::GetTypeName_abi_cxx11_(&local_1c8,(value *)0x28,tyid_09);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"Failed to parse value with requested type `",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1c8);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_220,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"[]`");
      poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&local_220);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&local_220);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    }
    ::std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              ((_Vector_base<float,_std::allocator<float>_> *)&typed_val);
    break;
  case 0x29:
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<std::array<float,2ul>>
                      (this,(vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                             *)&typed_val);
    if (bVar1) {
      linb::any::
      construct<std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>const&>
                ((any *)&ss_e,
                 (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                 &typed_val);
      linb::any::operator=((any *)&local_200,(any *)&ss_e);
      if (local_198 != (vtable_type *)0x0) {
        (*local_198->destroy)((storage_union *)&ss_e);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValueOfArrayType");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xb2);
      ::std::operator<<(poVar2," ");
      tinyusdz::value::GetTypeName_abi_cxx11_(&local_1c8,(value *)0x29,tyid_20);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"Failed to parse value with requested type `",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1c8);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_220,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"[]`");
      poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&local_220);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&local_220);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    }
    ::std::_Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::
    ~_Vector_base((_Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                  &typed_val);
    break;
  case 0x2a:
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<std::array<float,3ul>>
                      (this,(vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                             *)&typed_val);
    if (bVar1) {
      linb::any::
      construct<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>const&>
                ((any *)&ss_e,
                 (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                 &typed_val);
      linb::any::operator=((any *)&local_200,(any *)&ss_e);
      if (local_198 != (vtable_type *)0x0) {
        (*local_198->destroy)((storage_union *)&ss_e);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValueOfArrayType");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xb3);
      ::std::operator<<(poVar2," ");
      tinyusdz::value::GetTypeName_abi_cxx11_(&local_1c8,(value *)0x2a,tyid_13);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"Failed to parse value with requested type `",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1c8);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_220,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"[]`");
      poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&local_220);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&local_220);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    }
    ::std::_Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
    ~_Vector_base((_Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                  &typed_val);
    break;
  case 0x2b:
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<std::array<float,4ul>>
                      (this,(vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                             *)&typed_val);
    if (bVar1) {
      linb::any::
      construct<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>const&>
                ((any *)&ss_e,
                 (vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                 &typed_val);
      linb::any::operator=((any *)&local_200,(any *)&ss_e);
      if (local_198 != (vtable_type *)0x0) {
        (*local_198->destroy)((storage_union *)&ss_e);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValueOfArrayType");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xb4);
      ::std::operator<<(poVar2," ");
      tinyusdz::value::GetTypeName_abi_cxx11_(&local_1c8,(value *)0x2b,tyid_04);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"Failed to parse value with requested type `",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1c8);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_220,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"[]`");
      poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&local_220);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&local_220);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    }
    ::std::_Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::
    ~_Vector_base((_Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                  &typed_val);
    break;
  case 0x2c:
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<double>(this,(vector<double,_std::allocator<double>_> *)&typed_val);
    if (bVar1) {
      linb::any::construct<std::vector<double,std::allocator<double>>const&>
                ((any *)&ss_e,(vector<double,_std::allocator<double>_> *)&typed_val);
      linb::any::operator=((any *)&local_200,(any *)&ss_e);
      if (local_198 != (vtable_type *)0x0) {
        (*local_198->destroy)((storage_union *)&ss_e);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValueOfArrayType");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xb5);
      ::std::operator<<(poVar2," ");
      tinyusdz::value::GetTypeName_abi_cxx11_(&local_1c8,(value *)0x2c,tyid_24);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"Failed to parse value with requested type `",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1c8);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_220,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"[]`");
      poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&local_220);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&local_220);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    }
    ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&typed_val);
    break;
  case 0x2d:
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<std::array<double,2ul>>
                      (this,(vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                             *)&typed_val);
    if (bVar1) {
      linb::any::
      construct<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>const&>
                ((any *)&ss_e,
                 (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                 &typed_val);
      linb::any::operator=((any *)&local_200,(any *)&ss_e);
      if (local_198 != (vtable_type *)0x0) {
        (*local_198->destroy)((storage_union *)&ss_e);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValueOfArrayType");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xb6);
      ::std::operator<<(poVar2," ");
      tinyusdz::value::GetTypeName_abi_cxx11_(&local_1c8,(value *)0x2d,tyid_25);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"Failed to parse value with requested type `",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1c8);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_220,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"[]`");
      poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&local_220);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&local_220);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    }
    ::std::_Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
    ~_Vector_base((_Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                   *)&typed_val);
    break;
  case 0x2e:
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<std::array<double,3ul>>
                      (this,(vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                             *)&typed_val);
    if (bVar1) {
      linb::any::
      construct<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>const&>
                ((any *)&ss_e,
                 (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                 &typed_val);
      linb::any::operator=((any *)&local_200,(any *)&ss_e);
      if (local_198 != (vtable_type *)0x0) {
        (*local_198->destroy)((storage_union *)&ss_e);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValueOfArrayType");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xb7);
      ::std::operator<<(poVar2," ");
      tinyusdz::value::GetTypeName_abi_cxx11_(&local_1c8,(value *)0x2e,tyid_32);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"Failed to parse value with requested type `",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1c8);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_220,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"[]`");
      poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&local_220);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&local_220);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    }
    ::std::_Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::
    ~_Vector_base((_Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                   *)&typed_val);
    break;
  case 0x2f:
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<std::array<double,4ul>>
                      (this,(vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                             *)&typed_val);
    if (bVar1) {
      linb::any::
      construct<std::vector<std::array<double,4ul>,std::allocator<std::array<double,4ul>>>const&>
                ((any *)&ss_e,
                 (vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)
                 &typed_val);
      linb::any::operator=((any *)&local_200,(any *)&ss_e);
      if (local_198 != (vtable_type *)0x0) {
        (*local_198->destroy)((storage_union *)&ss_e);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValueOfArrayType");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xb8);
      ::std::operator<<(poVar2," ");
      tinyusdz::value::GetTypeName_abi_cxx11_(&local_1c8,(value *)0x2f,tyid_30);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"Failed to parse value with requested type `",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1c8);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_220,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"[]`");
      poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&local_220);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&local_220);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    }
    ::std::_Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>::
    ~_Vector_base((_Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                   *)&typed_val);
    break;
  case 0x30:
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<tinyusdz::value::quath>
                      (this,(vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                             *)&typed_val);
    if (bVar1) {
      linb::any::
      construct<std::vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>>const&>
                ((any *)&ss_e,
                 (vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)
                 &typed_val);
      linb::any::operator=((any *)&local_200,(any *)&ss_e);
      if (local_198 != (vtable_type *)0x0) {
        (*local_198->destroy)((storage_union *)&ss_e);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValueOfArrayType");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xb9);
      ::std::operator<<(poVar2," ");
      tinyusdz::value::GetTypeName_abi_cxx11_(&local_1c8,(value *)0x30,tyid_02);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"Failed to parse value with requested type `",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1c8);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_220,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"[]`");
      poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&local_220);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&local_220);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    }
    ::std::_Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)
                  &typed_val);
    break;
  case 0x31:
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<tinyusdz::value::quatf>
                      (this,(vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                             *)&typed_val);
    if (bVar1) {
      linb::any::
      construct<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>const&>
                ((any *)&ss_e,
                 (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                 &typed_val);
      linb::any::operator=((any *)&local_200,(any *)&ss_e);
      if (local_198 != (vtable_type *)0x0) {
        (*local_198->destroy)((storage_union *)&ss_e);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValueOfArrayType");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xba);
      ::std::operator<<(poVar2," ");
      tinyusdz::value::GetTypeName_abi_cxx11_(&local_1c8,(value *)0x31,tyid_14);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"Failed to parse value with requested type `",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1c8);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_220,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"[]`");
      poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&local_220);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&local_220);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    }
    ::std::_Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                  &typed_val);
    break;
  case 0x32:
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<tinyusdz::value::quatd>
                      (this,(vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                             *)&typed_val);
    if (bVar1) {
      linb::any::
      construct<std::vector<tinyusdz::value::quatd,std::allocator<tinyusdz::value::quatd>>const&>
                ((any *)&ss_e,
                 (vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *)
                 &typed_val);
      linb::any::operator=((any *)&local_200,(any *)&ss_e);
      if (local_198 != (vtable_type *)0x0) {
        (*local_198->destroy)((storage_union *)&ss_e);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValueOfArrayType");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xbb);
      ::std::operator<<(poVar2," ");
      tinyusdz::value::GetTypeName_abi_cxx11_(&local_1c8,(value *)0x32,tyid_33);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"Failed to parse value with requested type `",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1c8);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_220,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"[]`");
      poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&local_220);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&local_220);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    }
    ::std::_Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *)
                  &typed_val);
    break;
  case 0x33:
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<tinyusdz::value::matrix2f>
                      (this,(vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
                             *)&typed_val);
    if (bVar1) {
      linb::any::
      construct<std::vector<tinyusdz::value::matrix2f,std::allocator<tinyusdz::value::matrix2f>>const&>
                ((any *)&ss_e,
                 (vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_> *)
                 &typed_val);
      linb::any::operator=((any *)&local_200,(any *)&ss_e);
      if (local_198 != (vtable_type *)0x0) {
        (*local_198->destroy)((storage_union *)&ss_e);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValueOfArrayType");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xc5);
      ::std::operator<<(poVar2," ");
      tinyusdz::value::GetTypeName_abi_cxx11_(&local_1c8,(value *)0x33,tyid_03);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"Failed to parse value with requested type `",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1c8);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_220,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"[]`");
      poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&local_220);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&local_220);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    }
    ::std::_Vector_base<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
                   *)&typed_val);
    break;
  case 0x34:
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<tinyusdz::value::matrix3f>
                      (this,(vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                             *)&typed_val);
    if (bVar1) {
      linb::any::
      construct<std::vector<tinyusdz::value::matrix3f,std::allocator<tinyusdz::value::matrix3f>>const&>
                ((any *)&ss_e,
                 (vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_> *)
                 &typed_val);
      linb::any::operator=((any *)&local_200,(any *)&ss_e);
      if (local_198 != (vtable_type *)0x0) {
        (*local_198->destroy)((storage_union *)&ss_e);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValueOfArrayType");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xc6);
      ::std::operator<<(poVar2," ");
      tinyusdz::value::GetTypeName_abi_cxx11_(&local_1c8,(value *)0x34,tyid_12);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"Failed to parse value with requested type `",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1c8);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_220,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"[]`");
      poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&local_220);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&local_220);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    }
    ::std::_Vector_base<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                   *)&typed_val);
    break;
  case 0x35:
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<tinyusdz::value::matrix4f>
                      (this,(vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
                             *)&typed_val);
    if (bVar1) {
      linb::any::
      construct<std::vector<tinyusdz::value::matrix4f,std::allocator<tinyusdz::value::matrix4f>>const&>
                ((any *)&ss_e,
                 (vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_> *)
                 &typed_val);
      linb::any::operator=((any *)&local_200,(any *)&ss_e);
      if (local_198 != (vtable_type *)0x0) {
        (*local_198->destroy)((storage_union *)&ss_e);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValueOfArrayType");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,199);
      ::std::operator<<(poVar2," ");
      tinyusdz::value::GetTypeName_abi_cxx11_(&local_1c8,(value *)0x35,tyid_08);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"Failed to parse value with requested type `",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1c8);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_220,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"[]`");
      poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&local_220);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&local_220);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    }
    ::std::_Vector_base<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
                   *)&typed_val);
    break;
  case 0x36:
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<tinyusdz::value::matrix2d>
                      (this,(vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                             *)&typed_val);
    if (bVar1) {
      linb::any::
      construct<std::vector<tinyusdz::value::matrix2d,std::allocator<tinyusdz::value::matrix2d>>const&>
                ((any *)&ss_e,
                 (vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_> *)
                 &typed_val);
      linb::any::operator=((any *)&local_200,(any *)&ss_e);
      if (local_198 != (vtable_type *)0x0) {
        (*local_198->destroy)((storage_union *)&ss_e);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValueOfArrayType");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,200);
      ::std::operator<<(poVar2," ");
      tinyusdz::value::GetTypeName_abi_cxx11_(&local_1c8,(value *)0x36,tyid_23);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"Failed to parse value with requested type `",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1c8);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_220,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"[]`");
      poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&local_220);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&local_220);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    }
    ::std::_Vector_base<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                   *)&typed_val);
    break;
  case 0x37:
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<tinyusdz::value::matrix3d>
                      (this,(vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                             *)&typed_val);
    if (bVar1) {
      linb::any::
      construct<std::vector<tinyusdz::value::matrix3d,std::allocator<tinyusdz::value::matrix3d>>const&>
                ((any *)&ss_e,
                 (vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_> *)
                 &typed_val);
      linb::any::operator=((any *)&local_200,(any *)&ss_e);
      if (local_198 != (vtable_type *)0x0) {
        (*local_198->destroy)((storage_union *)&ss_e);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValueOfArrayType");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xc9);
      ::std::operator<<(poVar2," ");
      tinyusdz::value::GetTypeName_abi_cxx11_(&local_1c8,(value *)0x37,tyid_05);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"Failed to parse value with requested type `",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1c8);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_220,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"[]`");
      poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&local_220);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&local_220);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    }
    ::std::_Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                   *)&typed_val);
    break;
  case 0x38:
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<tinyusdz::value::matrix4d>
                      (this,(vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                             *)&typed_val);
    if (bVar1) {
      linb::any::
      construct<std::vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>const&>
                ((any *)&ss_e,
                 (vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)
                 &typed_val);
      linb::any::operator=((any *)&local_200,(any *)&ss_e);
      if (local_198 != (vtable_type *)0x0) {
        (*local_198->destroy)((storage_union *)&ss_e);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValueOfArrayType");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xca);
      ::std::operator<<(poVar2," ");
      tinyusdz::value::GetTypeName_abi_cxx11_(&local_1c8,(value *)0x38,tyid_35);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"Failed to parse value with requested type `",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1c8);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_220,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"[]`");
      poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&local_220);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&local_220);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    }
    ::std::_Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                   *)&typed_val);
    break;
  case 0x3a:
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<tinyusdz::value::color3f>
                      (this,(vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                             *)&typed_val);
    if (bVar1) {
      linb::any::
      construct<std::vector<tinyusdz::value::color3f,std::allocator<tinyusdz::value::color3f>>const&>
                ((any *)&ss_e,
                 (vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *)
                 &typed_val);
      linb::any::operator=((any *)&local_200,(any *)&ss_e);
      if (local_198 != (vtable_type *)0x0) {
        (*local_198->destroy)((storage_union *)&ss_e);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValueOfArrayType");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xbc);
      ::std::operator<<(poVar2," ");
      tinyusdz::value::GetTypeName_abi_cxx11_(&local_1c8,(value *)0x3a,tyid_34);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"Failed to parse value with requested type `",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1c8);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_220,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"[]`");
      poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&local_220);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&local_220);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    }
    ::std::_Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                   *)&typed_val);
    break;
  case 0x3b:
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<tinyusdz::value::color3d>
                      (this,(vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                             *)&typed_val);
    if (bVar1) {
      linb::any::
      construct<std::vector<tinyusdz::value::color3d,std::allocator<tinyusdz::value::color3d>>const&>
                ((any *)&ss_e,
                 (vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *)
                 &typed_val);
      linb::any::operator=((any *)&local_200,(any *)&ss_e);
      if (local_198 != (vtable_type *)0x0) {
        (*local_198->destroy)((storage_union *)&ss_e);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValueOfArrayType");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xbe);
      ::std::operator<<(poVar2," ");
      tinyusdz::value::GetTypeName_abi_cxx11_(&local_1c8,(value *)0x3b,tyid_10);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"Failed to parse value with requested type `",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1c8);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_220,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"[]`");
      poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&local_220);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&local_220);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    }
    ::std::_Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                   *)&typed_val);
    break;
  case 0x3d:
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<tinyusdz::value::color4f>
                      (this,(vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                             *)&typed_val);
    if (bVar1) {
      linb::any::
      construct<std::vector<tinyusdz::value::color4f,std::allocator<tinyusdz::value::color4f>>const&>
                ((any *)&ss_e,
                 (vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *)
                 &typed_val);
      linb::any::operator=((any *)&local_200,(any *)&ss_e);
      if (local_198 != (vtable_type *)0x0) {
        (*local_198->destroy)((storage_union *)&ss_e);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValueOfArrayType");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xbd);
      ::std::operator<<(poVar2," ");
      tinyusdz::value::GetTypeName_abi_cxx11_(&local_1c8,(value *)0x3d,tyid_15);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"Failed to parse value with requested type `",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1c8);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_220,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"[]`");
      poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&local_220);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&local_220);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    }
    ::std::_Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                   *)&typed_val);
    break;
  case 0x3e:
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<tinyusdz::value::color4d>
                      (this,(vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                             *)&typed_val);
    if (bVar1) {
      linb::any::
      construct<std::vector<tinyusdz::value::color4d,std::allocator<tinyusdz::value::color4d>>const&>
                ((any *)&ss_e,
                 (vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *)
                 &typed_val);
      linb::any::operator=((any *)&local_200,(any *)&ss_e);
      if (local_198 != (vtable_type *)0x0) {
        (*local_198->destroy)((storage_union *)&ss_e);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValueOfArrayType");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xbf);
      ::std::operator<<(poVar2," ");
      tinyusdz::value::GetTypeName_abi_cxx11_(&local_1c8,(value *)0x3e,tyid_28);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"Failed to parse value with requested type `",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1c8);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_220,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"[]`");
      poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&local_220);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&local_220);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    }
    ::std::_Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                   *)&typed_val);
    break;
  case 0x40:
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<tinyusdz::value::point3f>
                      (this,(vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                             *)&typed_val);
    if (bVar1) {
      linb::any::
      construct<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>const&>
                ((any *)&ss_e,
                 (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
                 &typed_val);
      linb::any::operator=((any *)&local_200,(any *)&ss_e);
      if (local_198 != (vtable_type *)0x0) {
        (*local_198->destroy)((storage_union *)&ss_e);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValueOfArrayType");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xc2);
      ::std::operator<<(poVar2," ");
      tinyusdz::value::GetTypeName_abi_cxx11_(&local_1c8,(value *)0x40,tyid_16);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"Failed to parse value with requested type `",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1c8);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_220,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"[]`");
      poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&local_220);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&local_220);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    }
    ::std::_Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                   *)&typed_val);
    break;
  case 0x43:
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<tinyusdz::value::normal3f>
                      (this,(vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                             *)&typed_val);
    if (bVar1) {
      linb::any::
      construct<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>const&>
                ((any *)&ss_e,
                 (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *)
                 &typed_val);
      linb::any::operator=((any *)&local_200,(any *)&ss_e);
      if (local_198 != (vtable_type *)0x0) {
        (*local_198->destroy)((storage_union *)&ss_e);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValueOfArrayType");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xc1);
      ::std::operator<<(poVar2," ");
      tinyusdz::value::GetTypeName_abi_cxx11_(&local_1c8,(value *)0x43,tyid_00);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"Failed to parse value with requested type `",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1c8);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_220,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"[]`");
      poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&local_220);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&local_220);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    }
    ::std::_Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                   *)&typed_val);
    break;
  case 0x46:
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<tinyusdz::value::vector3f>
                      (this,(vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                             *)&typed_val);
    if (bVar1) {
      linb::any::
      construct<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>const&>
                ((any *)&ss_e,
                 (vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *)
                 &typed_val);
      linb::any::operator=((any *)&local_200,(any *)&ss_e);
      if (local_198 != (vtable_type *)0x0) {
        (*local_198->destroy)((storage_union *)&ss_e);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValueOfArrayType");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xc0);
      ::std::operator<<(poVar2," ");
      tinyusdz::value::GetTypeName_abi_cxx11_(&local_1c8,(value *)0x46,tyid_06);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"Failed to parse value with requested type `",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1c8);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_220,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"[]`");
      poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&local_220);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&local_220);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    }
    ::std::_Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                   *)&typed_val);
    break;
  case 0x4a:
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<tinyusdz::value::texcoord2f>
                      (this,(vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                             *)&typed_val);
    if (bVar1) {
      linb::any::
      construct<std::vector<tinyusdz::value::texcoord2f,std::allocator<tinyusdz::value::texcoord2f>>const&>
                ((any *)&ss_e,
                 (vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                  *)&typed_val);
      linb::any::operator=((any *)&local_200,(any *)&ss_e);
      if (local_198 != (vtable_type *)0x0) {
        (*local_198->destroy)((storage_union *)&ss_e);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValueOfArrayType");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xc3);
      ::std::operator<<(poVar2," ");
      tinyusdz::value::GetTypeName_abi_cxx11_(&local_1c8,(value *)0x4a,tyid_31);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"Failed to parse value with requested type `",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1c8);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_220,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"[]`");
      poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&local_220);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&local_220);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    }
    ::std::_Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                   *)&typed_val);
    break;
  case 0x4d:
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<tinyusdz::value::texcoord3f>
                      (this,(vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                             *)&typed_val);
    if (bVar1) {
      linb::any::
      construct<std::vector<tinyusdz::value::texcoord3f,std::allocator<tinyusdz::value::texcoord3f>>const&>
                ((any *)&ss_e,
                 (vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                  *)&typed_val);
      linb::any::operator=((any *)&local_200,(any *)&ss_e);
      if (local_198 != (vtable_type *)0x0) {
        (*local_198->destroy)((storage_union *)&ss_e);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValueOfArrayType");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xc4);
      ::std::operator<<(poVar2," ");
      tinyusdz::value::GetTypeName_abi_cxx11_(&local_1c8,(value *)0x4d,tyid_36);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"Failed to parse value with requested type `",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1c8);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_220,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"[]`");
      poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&local_220);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&local_220);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    }
    ::std::_Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                   *)&typed_val);
    break;
  case 0x51:
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    typed_val.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = ParseBasicTypeArray<tinyusdz::value::AssetPath>
                      (this,(vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                             *)&typed_val);
    if (bVar1) {
      linb::any::
      construct<std::vector<tinyusdz::value::AssetPath,std::allocator<tinyusdz::value::AssetPath>>const&>
                ((any *)&ss_e,
                 (vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_> *)
                 &typed_val);
      linb::any::operator=((any *)&local_200,(any *)&ss_e);
      if (local_198 != (vtable_type *)0x0) {
        (*local_198->destroy)((storage_union *)&ss_e);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValueOfArrayType");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xa5);
      ::std::operator<<(poVar2," ");
      tinyusdz::value::GetTypeName_abi_cxx11_(&local_1c8,(value *)0x51,tyid_01);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"Failed to parse value with requested type `",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1c8);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_220,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e8,"[]`");
      poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&local_220);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&local_220);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    }
    ::std::vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>::~vector
              ((vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_> *)
               &typed_val);
  }
  if (bVar1 == false) {
LAB_002d7646:
    bVar1 = false;
  }
  else {
    linb::any::operator=(&result->v_,(any *)&local_200);
    bVar1 = true;
  }
  if (local_1f0 != (undefined **)0x0) {
    (*(code *)local_1f0[4])(&local_200);
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ParseTimeSampleValueOfArrayType(const uint32_t type_id, value::Value *result) {

  if (!result) {
    return false;
  }

  if (MaybeNone()) {
    (*result) = value::ValueBlock();
    return true;
  }

  value::Value val;

#define PARSE_TYPE(__tyid, __type)                       \
  if (__tyid == value::TypeTraits<__type>::type_id()) {             \
    std::vector<__type> typed_val; \
    if (!ParseBasicTypeArray(&typed_val)) {                             \
      PUSH_ERROR_AND_RETURN("Failed to parse value with requested type `" + value::GetTypeName(__tyid) + "[]`"); \
    }                                                                  \
    val = value::Value(typed_val); \
  } else

  // NOTE: `string` does not support multi-line string.
  PARSE_TYPE(type_id, value::AssetPath)
  PARSE_TYPE(type_id, value::token)
  PARSE_TYPE(type_id, std::string)
  PARSE_TYPE(type_id, float)
  PARSE_TYPE(type_id, int32_t)
  PARSE_TYPE(type_id, uint32_t)
  PARSE_TYPE(type_id, int64_t)
  PARSE_TYPE(type_id, uint64_t)
  PARSE_TYPE(type_id, value::half)
  PARSE_TYPE(type_id, value::half2)
  PARSE_TYPE(type_id, value::half3)
  PARSE_TYPE(type_id, value::half4)
  PARSE_TYPE(type_id, float)
  PARSE_TYPE(type_id, value::float2)
  PARSE_TYPE(type_id, value::float3)
  PARSE_TYPE(type_id, value::float4)
  PARSE_TYPE(type_id, double)
  PARSE_TYPE(type_id, value::double2)
  PARSE_TYPE(type_id, value::double3)
  PARSE_TYPE(type_id, value::double4)
  PARSE_TYPE(type_id, value::quath)
  PARSE_TYPE(type_id, value::quatf)
  PARSE_TYPE(type_id, value::quatd)
  PARSE_TYPE(type_id, value::color3f)
  PARSE_TYPE(type_id, value::color4f)
  PARSE_TYPE(type_id, value::color3d)
  PARSE_TYPE(type_id, value::color4d)
  PARSE_TYPE(type_id, value::vector3f)
  PARSE_TYPE(type_id, value::normal3f)
  PARSE_TYPE(type_id, value::point3f)
  PARSE_TYPE(type_id, value::texcoord2f)
  PARSE_TYPE(type_id, value::texcoord3f)
  PARSE_TYPE(type_id, value::matrix2f)
  PARSE_TYPE(type_id, value::matrix3f)
  PARSE_TYPE(type_id, value::matrix4f)
  PARSE_TYPE(type_id, value::matrix2d)
  PARSE_TYPE(type_id, value::matrix3d)
  PARSE_TYPE(type_id, value::matrix4d) {
    PUSH_ERROR_AND_RETURN(" : TODO: timeSamples type " + value::GetTypeName(type_id));
  }

#undef PARSE_TYPE

  (*result) = val;

  return true;

}